

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O1

void __thiscall
cppcms::sessions::session_file_storage::~session_file_storage(session_file_storage *this)

{
  uint uVar1;
  pointer paVar2;
  pointer pcVar3;
  _data *p_Var4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  (this->super_session_storage)._vptr_session_storage = (_func_int **)&PTR_save_0028e140;
  uVar1 = this->lock_size_;
  uVar7 = (ulong)uVar1;
  if (this->memory_ == (void *)0xffffffffffffffff) {
    if (uVar1 != 0) {
      lVar5 = 0;
      uVar7 = 0;
      do {
        pthread_mutex_destroy
                  ((pthread_mutex_t *)
                   ((long)(this->mutexes_).
                          super__Vector_base<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar5));
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x28;
      } while (uVar7 < this->lock_size_);
    }
  }
  else {
    if (uVar1 != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        pthread_mutex_destroy((pthread_mutex_t *)((long)this->memory_ + lVar5));
        uVar6 = uVar6 + 1;
        uVar7 = (ulong)this->lock_size_;
        lVar5 = lVar5 + 0x28;
      } while (uVar6 < uVar7);
    }
    munmap(this->memory_,uVar7 * 0x28);
  }
  paVar2 = (this->mutexes_).super__Vector_base<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
  }
  pcVar3 = (this->path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->path_).field_2) {
    operator_delete(pcVar3);
  }
  p_Var4 = (this->d).ptr_;
  if (p_Var4 != (_data *)0x0) {
    operator_delete(p_Var4);
    return;
  }
  return;
}

Assistant:

session_file_storage::~session_file_storage()
{
	if(memory_ !=MAP_FAILED) {
		for(unsigned i=0;i<lock_size_;i++)
			destroy_mutex(reinterpret_cast<pthread_mutex_t *>(memory_) + i);
		munmap((char*)memory_,sizeof(pthread_mutex_t) * lock_size_);
	}
	else {
		for(unsigned i=0;i<lock_size_;i++)
			destroy_mutex(&mutexes_[i]);
	}
}